

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::resolveSubstitution
          (HighsCliqueTable *this,HighsInt *col,double *val,double *offset)

{
  const_reference pvVar1;
  const_reference pvVar2;
  double *in_RCX;
  double *in_RDX;
  uint *in_RSI;
  long in_RDI;
  Substitution subst;
  undefined4 uStack_24;
  
  while( true ) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),(long)(int)*in_RSI);
    if (*pvVar1 == 0) break;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),(long)(int)*in_RSI);
    pvVar2 = std::
             vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
             ::operator[]((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                           *)(in_RDI + 0x118),(long)(*pvVar1 + -1));
    uStack_24 = (*pvVar2).replace;
    if (-1 < (long)*pvVar2) {
      *in_RCX = *in_RDX + *in_RCX;
      *in_RDX = -*in_RDX;
    }
    *in_RSI = (uint)uStack_24 & 0x7fffffff;
  }
  return;
}

Assistant:

void HighsCliqueTable::resolveSubstitution(HighsInt& col, double& val,
                                           double& offset) const {
  while (colsubstituted[col]) {
    Substitution subst = substitutions[colsubstituted[col] - 1];
    if (subst.replace.val == 0) {
      offset += val;
      val = -val;
    }
    col = subst.replace.col;
  }
}